

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall
ON_SubDFace::RemoveEdgeFromArray(ON_SubDFace *this,uint i,ON_SubDEdgePtr *removed_edge)

{
  ushort uVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  
  removed_edge->m_ptr = (ON__UINT_PTR)(ON_SubDEdgePtr)0x0;
  uVar1 = this->m_edge_count;
  if (i < uVar1) {
    uVar3 = (ulong)i;
    if (i < 4) {
      removed_edge->m_ptr = this->m_edge4[uVar3].m_ptr;
    }
    if (4 < uVar1) {
      if ((this->m_edgex == (ON_SubDEdgePtr *)0x0) || (this->m_edgex_capacity + 4 < (uint)uVar1))
      goto LAB_005d4c26;
      if (3 < i) {
        removed_edge->m_ptr = this->m_edgex[uVar3 - 4].m_ptr;
      }
    }
    lVar4 = uVar3 * 8 + -0x18;
    pdVar5 = (this->super_ON_SubDComponentBase).m_saved_subd_point1 + (uVar3 - 3);
    lVar6 = uVar3 * 8 + -0x20;
    for (; (int)uVar3 + 1U < (uint)uVar1; uVar3 = uVar3 + 1) {
      puVar8 = (undefined8 *)((long)&this->m_edgex->m_ptr + lVar4);
      if (uVar3 < 3) {
        puVar8 = pdVar5 + 0x15;
      }
      puVar7 = pdVar5 + 0x14;
      if (3 < uVar3) {
        puVar7 = (undefined8 *)((long)&this->m_edgex->m_ptr + lVar6);
      }
      *puVar7 = *puVar8;
      lVar4 = lVar4 + 8;
      pdVar5 = pdVar5 + 1;
      lVar6 = lVar6 + 8;
    }
    this->m_edge_count = uVar1 - 1;
    bVar2 = true;
  }
  else {
LAB_005d4c26:
    ON_SubDIncrementErrorCount();
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_SubDFace::RemoveEdgeFromArray(
  unsigned int i,
  ON_SubDEdgePtr& removed_edge
  )
{
  removed_edge = ON_SubDEdgePtr::Null;
  unsigned int count = m_edge_count;
  if ( i >= count )
    return ON_SUBD_RETURN_ERROR(false);
  if (i < 4)
  {
    removed_edge = m_edge4[i];
  }
  if (count > 4)
  {
    if ( nullptr == m_edgex || m_edgex_capacity + ((unsigned short)4) < m_edge_count )
      return ON_SUBD_RETURN_ERROR(false);
    if ( i >= 4 )
      removed_edge = m_edgex[i-4];
  }

  unsigned int j = i+1;

  while (j < count)
  {
    const ON_SubDEdgePtr& edge_j = j < 4 ? m_edge4[j] : m_edgex[j - 4];
    if (i < 4)
      m_edge4[i] = edge_j;
    else
      m_edgex[i - 4] = edge_j;
    i++;
    j++;
  }

  m_edge_count--;

  return true;
}